

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void * __thiscall
pugi::impl::anon_unknown_0::xml_allocator::allocate_memory
          (xml_allocator *this,size_t size,xml_memory_page **out_page)

{
  void *buf;
  xml_memory_page **out_page_local;
  size_t size_local;
  xml_allocator *this_local;
  
  if (this->_busy_size + size < 0x7fd9) {
    this_local = (xml_allocator *)((long)&this->_root[1].allocator + this->_busy_size);
    this->_busy_size = size + this->_busy_size;
    *out_page = this->_root;
  }
  else {
    this_local = (xml_allocator *)allocate_memory_oob(this,size,out_page);
  }
  return this_local;
}

Assistant:

void* allocate_memory(size_t size, xml_memory_page*& out_page)
		{
			if (PUGI_IMPL_UNLIKELY(_busy_size + size > xml_memory_page_size))
				return allocate_memory_oob(size, out_page);

			void* buf = reinterpret_cast<char*>(_root) + sizeof(xml_memory_page) + _busy_size;

			_busy_size += size;

			out_page = _root;

			return buf;
		}